

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lls.c
# Opt level: O0

int lls_qr_determined(double *Ai,double *bi,int M,int N,double *xo)

{
  int iVar1;
  int iVar2;
  double *x_00;
  void *__ptr;
  void *__ptr_00;
  double *v_00;
  double *A_00;
  void *__ptr_01;
  double *C;
  double *A_01;
  long lVar3;
  double alpha;
  double local_98;
  double sum;
  double beta;
  double *R;
  double *A;
  double *b;
  double *bvec;
  double *w;
  double *AT;
  double *v;
  double *x;
  int l;
  int c1;
  int retcode;
  int t;
  int u;
  int k;
  int i;
  int j;
  double *xo_local;
  int N_local;
  int M_local;
  double *bi_local;
  double *Ai_local;
  
  if (N <= M) {
    x_00 = (double *)malloc((long)M << 3);
    __ptr = malloc((long)M << 3);
    __ptr_00 = malloc((long)N << 3);
    v_00 = (double *)malloc((long)M << 3);
    A_00 = (double *)malloc((long)M * 8 * (long)N);
    __ptr_01 = malloc((long)M * 8 * (long)N);
    C = (double *)malloc((long)N << 3);
    A_01 = (double *)malloc((long)N * 8 * (long)N);
    for (k = 0; k < M; k = k + 1) {
      *(double *)((long)__ptr + (long)k * 8) = bi[k];
    }
    for (k = 0; k < M * N; k = k + 1) {
      *(double *)((long)__ptr_01 + (long)k * 8) = Ai[k];
    }
    for (k = 0; k < N; k = k + 1) {
      for (u = k; u < M; u = u + 1) {
        x_00[u - k] = *(double *)((long)__ptr_01 + (long)(u * N + k) * 8);
      }
      alpha = house(x_00,M - k,v_00);
      *(double *)((long)__ptr_00 + (long)k * 8) = alpha;
      for (u = k; u < M; u = u + 1) {
        retcode = 0;
        for (t = k; t < N; t = t + 1) {
          A_00[(retcode + u) - k] = *(double *)((long)__ptr_01 + (long)(t + u * N) * 8);
          retcode = (M - k) + retcode;
        }
      }
      mmult(A_00,v_00,C,N - k,M - k,1);
      scale(C,N - k,1,alpha);
      mmult(v_00,C,A_00,M - k,1,N - k);
      for (u = k; u < M; u = u + 1) {
        for (t = k; t < N; t = t + 1) {
          lVar3 = (long)(u * N + t);
          *(double *)((long)__ptr_01 + lVar3 * 8) =
               *(double *)((long)__ptr_01 + lVar3 * 8) - A_00[((u - k) * (N - k) + t) - k];
        }
      }
      u = k;
      if (k < M) {
        while (u = u + 1, u < M) {
          *(double *)((long)__ptr_01 + (long)(u * N + k) * 8) = v_00[u - k];
        }
      }
    }
    for (u = 0; u < N; u = u + 1) {
      iVar1 = u * N;
      for (k = 0; k < N; k = k + 1) {
        if (k < u) {
          A_01[iVar1 + k] = 0.0;
        }
        else {
          A_01[iVar1 + k] = *(double *)((long)__ptr_01 + (long)(iVar1 + k) * 8);
        }
      }
    }
    iVar1 = rank(A_01,N,N);
    for (k = 0; k < N; k = k + 1) {
      v_00[k] = 1.0;
      u = k;
      while (u = u + 1, u < M) {
        v_00[u] = *(double *)((long)__ptr_01 + (long)(u * N + k) * 8);
      }
      mmult((double *)((long)__ptr + (long)k * 8),v_00 + k,C,1,M - k,1);
      *C = *C * *(double *)((long)__ptr_00 + (long)k * 8);
      for (u = k; u < M; u = u + 1) {
        v_00[u] = *C * v_00[u];
      }
      for (u = k; u < M; u = u + 1) {
        *(double *)((long)__ptr + (long)u * 8) = *(double *)((long)__ptr + (long)u * 8) - v_00[u];
      }
    }
    xo[N + -1] = *(double *)((long)__ptr + (long)(N + -1) * 8) / A_01[N * N + -1];
    for (u = N + -2; -1 < u; u = u + -1) {
      local_98 = 0.0;
      iVar2 = u * (N + 1);
      x._0_4_ = 0;
      k = u;
      while (k = k + 1, k < N) {
        x._0_4_ = (int)x + 1;
        local_98 = A_01[iVar2 + (int)x] * xo[k] + local_98;
      }
      xo[u] = (*(double *)((long)__ptr + (long)u * 8) - local_98) / A_01[iVar2];
    }
    free(x_00);
    free(v_00);
    free(A_00);
    free(C);
    free(__ptr_00);
    free(A_01);
    free(__ptr);
    free(__ptr_01);
    return iVar1;
  }
  printf("M should be greater than or equal to N");
  exit(-1);
}

Assistant:

static int lls_qr_determined(double *Ai,double *bi,int M,int N,double *xo) {
	int j,i,k,u,t,retcode,c1,l;
	double *x,*v,*AT,*w,*bvec,*b,*A,*R;
	double beta,sum;

	retcode = 0;

	if (M < N) {
			printf("M should be greater than or equal to N");
			exit(-1);
	}
	x = (double*) malloc(sizeof(double) * M);
	b = (double*) malloc(sizeof(double) * M);
	bvec = (double*) malloc(sizeof(double) * N);
	v = (double*) malloc(sizeof(double) * M);
	AT = (double*) malloc(sizeof(double) * M * N);
	A = (double*) malloc(sizeof(double) * M * N);
	w = (double*) malloc(sizeof(double) * N);
	R = (double*) malloc(sizeof(double) * N * N);

	for(j = 0; j < M;++j) {
		b[j] = bi[j];
	}
	for(j = 0; j < M*N;++j) {
		A[j] = Ai[j];
	}

	for(j = 0; j < N;++j) {
		for(i=j;i < M;++i) {
			x[i-j] = A[i*N+j];

		}

		beta = house(x,M-j,v);
		bvec[j] = beta;

		for (i=j; i < M; i++) {
			t = i * N;
			u = 0;
			for (k=j; k < N; k++) {
				AT[u+i-j] = A[k+t];
				u+=(M-j);

			}

		}


		mmult(AT,v,w,N-j,M-j,1);
		scale(w,N-j,1,beta);
		mmult(v,w,AT,M-j,1,N-j);
		for (i=j; i < M; i++) {
			t = i *N;
			for (k=j; k < N; k++) {
				A[t+k] -= AT[(i-j)*(N-j) + k - j];
			}
		}
		if (j < M) {

			for(i=j+1;i < M;++i) {
				A[i*N+j] = v[i-j];
			}
		}

	}

	for(i = 0; i < N;++i) {
		t = i *N;
		for(j = 0; j < N;++j) {
			if (i > j) {
				R[t+j] = 0.;
			} else {
				R[t+j] = A[t+j];
			}
		}
	}

	//Calculate Rank of R

	retcode = rank(R,N,N);


	for(j = 0; j < N;++j) {
		v[j] = 1;
		for(i = j+1; i < M;++i) {
			v[i] = A[i * N + j];//edit
		}
		mmult(b+j,v+j,w,1,M-j,1);
		*w = *w * bvec[j];
		for(i = j; i < M;++i) {
			v[i] = *w * v[i];
		}
		for(i = j; i < M;++i) {
			b[i] = b[i] - v[i];
		}


	}

	//mdisplay(b,1,M);

	//back substitution

	xo[N - 1] = b[N - 1]/R[N * N - 1];

	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += R[c1 + l] * xo[j];
		}
		xo[i] = (b[i] - sum) / R[c1];
	}

	free(x);
	free(v);
	free(AT);
	free(w);
	free(bvec);
	free(R);
	free(b);
	free(A);

	return retcode;
}